

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O3

void __thiscall YAJLTables::fetch_etable(YAJLTables *this,u16 marker,bitio_stream *bstream)

{
  undefined8 *puVar1;
  ulong uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  unkuint9 Var17;
  undefined1 auVar18 [11];
  undefined1 auVar19 [13];
  undefined1 auVar20 [15];
  unkuint9 Var21;
  undefined1 auVar22 [11];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  ssize_t sVar27;
  YAJLArithmeticTable *this_00;
  ulong uVar28;
  YAJLHuffmanTable *this_01;
  undefined8 extraout_RAX;
  size_t in_RCX;
  ulong uVar29;
  int iVar30;
  undefined6 in_register_00000032;
  void *unaff_R13;
  ushort uVar31;
  uint uVar32;
  undefined1 local_48 [8];
  undefined1 auStack_40 [16];
  
  sVar27 = bitio::bitio_stream::read(bstream,0x10,bstream,in_RCX);
  uVar32 = (int)sVar27 - 2;
  iVar30 = (int)CONCAT62(in_register_00000032,marker);
  uVar31 = (ushort)uVar32;
  if (iVar30 == 0xffc4) {
    while (uVar31 != 0) {
      local_48._0_2_ = 0;
      auStack_40 = (undefined1  [16])0x0;
      YAJLEntropyTable::set_marker((YAJLEntropyTable *)local_48,0xffc4);
      this_01 = (YAJLHuffmanTable *)operator_new(0x28);
      YAJLHuffmanTable::YAJLHuffmanTable(this_01,bstream);
      auStack_40._0_8_ = this_01;
      if (3 < this_01->table_dest) {
        __assert_fail("etable.huffman_table->table_dest < 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/misc.cpp"
                      ,0x5e,"void YAJLTables::fetch_etable(u16, bitio::bitio_stream *)");
      }
      uVar28 = (ulong)this_01->table_class;
      if (1 < uVar28) {
        __assert_fail("etable.huffman_table->table_class < 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/misc.cpp"
                      ,0x5f,"void YAJLTables::fetch_etable(u16, bitio::bitio_stream *)");
      }
      uVar29 = *(ulong *)this_01->ncodes;
      auVar4._8_6_ = 0;
      auVar4._0_8_ = uVar29;
      auVar4[0xe] = (char)(uVar29 >> 0x38);
      auVar6._8_4_ = 0;
      auVar6._0_8_ = uVar29;
      auVar6[0xc] = (char)(uVar29 >> 0x30);
      auVar6._13_2_ = auVar4._13_2_;
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar29;
      auVar8._12_3_ = auVar6._12_3_;
      auVar10._8_2_ = 0;
      auVar10._0_8_ = uVar29;
      auVar10[10] = (char)(uVar29 >> 0x28);
      auVar10._11_4_ = auVar8._11_4_;
      auVar12._8_2_ = 0;
      auVar12._0_8_ = uVar29;
      auVar12._10_5_ = auVar10._10_5_;
      auVar14[8] = (char)(uVar29 >> 0x20);
      auVar14._0_8_ = uVar29;
      auVar14._9_6_ = auVar12._9_6_;
      auVar16._7_8_ = 0;
      auVar16._0_7_ = auVar14._8_7_;
      Var17 = CONCAT81(SUB158(auVar16 << 0x40,7),(char)(uVar29 >> 0x18));
      auVar23._9_6_ = 0;
      auVar23._0_9_ = Var17;
      auVar18._1_10_ = SUB1510(auVar23 << 0x30,5);
      auVar18[0] = (char)(uVar29 >> 0x10);
      auVar24._11_4_ = 0;
      auVar24._0_11_ = auVar18;
      auVar19._1_12_ = SUB1512(auVar24 << 0x20,3);
      auVar19[0] = (char)(uVar29 >> 8);
      uVar2 = *(ulong *)(this_01->ncodes + 8);
      auVar3._8_6_ = 0;
      auVar3._0_8_ = uVar2;
      auVar3[0xe] = (char)(uVar2 >> 0x38);
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar2;
      auVar5[0xc] = (char)(uVar2 >> 0x30);
      auVar5._13_2_ = auVar3._13_2_;
      auVar7._8_4_ = 0;
      auVar7._0_8_ = uVar2;
      auVar7._12_3_ = auVar5._12_3_;
      auVar9._8_2_ = 0;
      auVar9._0_8_ = uVar2;
      auVar9[10] = (char)(uVar2 >> 0x28);
      auVar9._11_4_ = auVar7._11_4_;
      auVar11._8_2_ = 0;
      auVar11._0_8_ = uVar2;
      auVar11._10_5_ = auVar9._10_5_;
      auVar13[8] = (char)(uVar2 >> 0x20);
      auVar13._0_8_ = uVar2;
      auVar13._9_6_ = auVar11._9_6_;
      auVar20._7_8_ = 0;
      auVar20._0_7_ = auVar13._8_7_;
      Var21 = CONCAT81(SUB158(auVar20 << 0x40,7),(char)(uVar2 >> 0x18));
      auVar25._9_6_ = 0;
      auVar25._0_9_ = Var21;
      auVar22._1_10_ = SUB1510(auVar25 << 0x30,5);
      auVar22[0] = (char)(uVar2 >> 0x10);
      auVar26._11_4_ = 0;
      auVar26._0_11_ = auVar22;
      auVar15[2] = (char)(uVar2 >> 8);
      auVar15._0_2_ = (ushort)uVar2;
      auVar15._3_12_ = SUB1512(auVar26 << 0x20,3);
      uVar31 = (-((auVar3._13_2_ >> 8) + (auVar4._13_2_ >> 8)) - ((short)Var21 + (short)Var17)) +
               (-(auVar9._10_2_ + auVar10._10_2_) - (auVar15._2_2_ + auVar19._0_2_)) +
               (-(auVar5._12_2_ + auVar6._12_2_) - (auVar22._0_2_ + auVar18._0_2_)) +
               ((((short)uVar32 + -0x11) - (((ushort)uVar2 & 0xff) + (ushort)(byte)uVar29)) -
               (auVar13._8_2_ + auVar14._8_2_));
      uVar32 = (uint)uVar31;
      uVar29 = (ulong)((uint)this_01->table_dest * 0x30);
      *(undefined8 *)((long)&this->etables[0][uVar28].arithmetic_table + uVar29) = auStack_40._8_8_;
      puVar1 = (undefined8 *)((long)&this->etables[0][uVar28].marker + uVar29);
      *puVar1 = CONCAT62(local_48._2_6_,local_48._0_2_);
      puVar1[1] = this_01;
    }
  }
  else {
    if (iVar30 != 0xffcc) {
      fetch_etable();
      operator_delete(unaff_R13,0x28);
      _Unwind_Resume(extraout_RAX);
    }
    while (uVar31 != 0) {
      local_48._0_2_ = 0;
      auStack_40 = ZEXT816(0);
      YAJLEntropyTable::set_marker((YAJLEntropyTable *)local_48,0xffcc);
      this_00 = (YAJLArithmeticTable *)operator_new(3);
      YAJLArithmeticTable::YAJLArithmeticTable(this_00,bstream);
      auStack_40._8_8_ = this_00;
      if (3 < this_00->table_dest) {
        __assert_fail("etable.arithmetic_table->table_dest < 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/misc.cpp"
                      ,0x69,"void YAJLTables::fetch_etable(u16, bitio::bitio_stream *)");
      }
      uVar28 = (ulong)this_00->table_class;
      if (1 < uVar28) {
        __assert_fail("etable.arithmetic_table->table_class < 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/misc.cpp"
                      ,0x6a,"void YAJLTables::fetch_etable(u16, bitio::bitio_stream *)");
      }
      uVar29 = (ulong)((uint)this_00->table_dest * 0x30);
      *(YAJLArithmeticTable **)((long)&this->etables[0][uVar28].arithmetic_table + uVar29) = this_00
      ;
      puVar1 = (undefined8 *)((long)&this->etables[0][uVar28].marker + uVar29);
      *puVar1 = CONCAT62(local_48._2_6_,local_48._0_2_);
      puVar1[1] = auStack_40._0_8_;
      uVar31 = (short)uVar32 - 2;
      uVar32 = (uint)uVar31;
    }
  }
  return;
}

Assistant:

void YAJLTables::fetch_etable(u16 marker, bitio::bitio_stream *bstream) {
    u16 length = bstream->read(0x10);
    length -= 2;
    if (marker == markers::DHT) {
        while (length > 0) {
            YAJLEntropyTable etable{};
            etable.set_marker(marker);
            etable.huffman_table = new YAJLHuffmanTable(bstream);

            length -= 17;
            for (int i = 0; i < 16; i++) {
                length -= etable.huffman_table->ncodes[i];
            }

            assert(etable.huffman_table->table_dest < 4);
            assert(etable.huffman_table->table_class < 2);

            etables[etable.huffman_table->table_dest][etable.huffman_table->table_class] = etable;
        }
    } else if (marker == markers::DAC) {
        while (length > 0) {
            YAJLEntropyTable etable{};
            etable.set_marker(marker);
            etable.arithmetic_table = new YAJLArithmeticTable(bstream);

            assert(etable.arithmetic_table->table_dest < 4);
            assert(etable.arithmetic_table->table_class < 2);
            etables[etable.arithmetic_table->table_dest][etable.arithmetic_table->table_class] = etable;
            length -= 2;
        }
    } else {
        fprintf(stderr, "Unhandled marker at: %s\n", __FILE__);
        exit(1);
    }
}